

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  uint uVar5;
  uint offCode;
  void *posInSrc;
  long lVar6;
  ulong uVar7;
  ulong in_RCX;
  long in_RDX;
  void *dst;
  uint *in_RSI;
  long in_RDI;
  void *in_R8;
  long *plVar8;
  long in_R9;
  int in_stack_00000008;
  U32 lastSeqIdx;
  U32 *rep;
  size_t err_code;
  U32 ll0;
  U32 offBase;
  U32 matchLength;
  U32 litLength;
  U32 dictSize;
  repcodes_t updatedRepcodes;
  BYTE *iend;
  BYTE *ip;
  U32 startIdx;
  U32 idx;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined2 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef2;
  undefined1 uVar9;
  uint in_stack_fffffffffffffef4;
  BYTE *in_stack_fffffffffffffef8;
  U32 *in_stack_ffffffffffffff00;
  U32 local_f4;
  undefined4 uVar10;
  U32 UVar11;
  U32 UVar12;
  U32 UStack_e0;
  U32 windowLog;
  void *pvVar13;
  uint matchLength_00;
  size_t local_90;
  void *local_38;
  void *local_30;
  
  matchLength_00 = *in_RSI;
  posInSrc = (void *)((long)in_R8 + in_R9);
  if (*(long *)(in_RDI + 0xe58) == 0) {
    if (*(long *)(in_RDI + 0xe60) == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (undefined4)*(undefined8 *)(in_RDI + 0xe68);
    }
  }
  else {
    uVar10 = (undefined4)*(undefined8 *)(*(long *)(in_RDI + 0xe58) + 8);
  }
  uVar3 = *(undefined8 *)(*(long *)(in_RDI + 0xc68) + 0x15f0);
  UVar11 = (U32)uVar3;
  UStack_e0 = (U32)((ulong)uVar3 >> 0x20);
  windowLog = *(U32 *)(*(long *)(in_RDI + 0xc68) + 0x15f8);
  offCode = matchLength_00;
  while( true ) {
    uVar9 = false;
    if ((offCode < in_RCX) &&
       (in_stack_fffffffffffffef2 = true, uVar9 = in_stack_fffffffffffffef2,
       *(int *)(in_RDX + (ulong)offCode * 0x10 + 8) == 0)) {
      in_stack_fffffffffffffef2 = *(int *)(in_RDX + (ulong)offCode * 0x10) != 0;
      uVar9 = in_stack_fffffffffffffef2;
    }
    if ((bool)uVar9 == false) {
      if (in_stack_00000008 == 0) {
        __assert_fail("externalRepSearch != ZSTD_ps_auto",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x69e4,
                      "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                     );
      }
      if (matchLength_00 <= offCode) {
        UVar12 = UVar11;
        if ((in_stack_00000008 == 2) && (offCode != matchLength_00)) {
          in_stack_fffffffffffffef4 = offCode - 1;
          if (in_stack_fffffffffffffef4 < matchLength_00 + 2) {
            if (in_stack_fffffffffffffef4 == matchLength_00 + 1) {
              UVar12 = *(U32 *)(in_RDX + (ulong)in_stack_fffffffffffffef4 * 0x10);
              windowLog = UVar11;
            }
            else {
              if (in_stack_fffffffffffffef4 != matchLength_00) {
                __assert_fail("lastSeqIdx == startIdx",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x69f3,
                              "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                             );
              }
              UVar12 = *(U32 *)(in_RDX + (ulong)in_stack_fffffffffffffef4 * 0x10);
              windowLog = UStack_e0;
            }
          }
          else {
            UVar12 = *(U32 *)(in_RDX + (ulong)in_stack_fffffffffffffef4 * 0x10);
            windowLog = *(U32 *)(in_RDX + (ulong)(offCode - 3) * 0x10);
          }
        }
        lVar4 = *(long *)(in_RDI + 0xc70);
        *(ulong *)(lVar4 + 0x15f0) = CONCAT44(UStack_e0,UVar12);
        *(U32 *)(lVar4 + 0x15f8) = windowLog;
        if (*(int *)(in_RDX + (ulong)offCode * 0x10 + 4) != 0) {
          ZSTD_storeLastLiterals
                    ((seqStore_t *)
                     CONCAT44(in_stack_fffffffffffffef4,
                              (uint)CONCAT12(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0)),
                     (BYTE *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0x2412e1)
          ;
          in_R8 = (void *)((long)in_R8 + (ulong)*(uint *)(in_RDX + (ulong)offCode * 0x10 + 4));
          *(ulong *)(in_RSI + 2) =
               (ulong)*(uint *)(in_RDX + (ulong)offCode * 0x10 + 4) + *(long *)(in_RSI + 2);
        }
        if (in_R8 == posInSrc) {
          *in_RSI = offCode + 1;
          local_90 = 0;
        }
        else {
          local_90 = 0xffffffffffffff95;
        }
        return local_90;
      }
      __assert_fail("idx >= startIdx",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x69e5,
                    "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                   );
    }
    uVar1 = *(uint *)(in_RDX + (ulong)offCode * 0x10 + 4);
    uVar2 = *(uint *)(in_RDX + (ulong)offCode * 0x10 + 8);
    if (in_stack_00000008 == 2) {
      if (*(int *)(in_RDX + (ulong)offCode * 0x10) == 0) {
        __assert_fail("(inSeqs[idx].offset)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x69cf,
                      "size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                     );
      }
      local_f4 = *(int *)(in_RDX + (ulong)offCode * 0x10) + 3;
    }
    else {
      local_f4 = ZSTD_finalizeOffBase
                           (in_stack_fffffffffffffef4,
                            (U32 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
      ZSTD_updateRep(in_stack_ffffffffffffff00,(U32)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (U32)in_stack_fffffffffffffef8);
    }
    if (*(int *)(in_RDI + 0x168) != 0) {
      *(ulong *)(in_RSI + 2) = (ulong)(uVar1 + uVar2) + *(long *)(in_RSI + 2);
      in_stack_fffffffffffffee8 = *(undefined4 *)(in_RDI + 0x198);
      in_stack_ffffffffffffff00 =
           (U32 *)ZSTD_validateSequence
                            (offCode,matchLength_00,(U32)((ulong)in_R8 >> 0x20),(size_t)posInSrc,
                             windowLog,CONCAT44(UVar11,uVar10),(int)in_RCX);
      uVar5 = ERR_isError((size_t)in_stack_ffffffffffffff00);
      if (uVar5 != 0) {
        return (size_t)in_stack_ffffffffffffff00;
      }
    }
    if (*(ulong *)(in_RDI + 0x3d8) <= (ulong)(offCode - *in_RSI)) {
      return 0xffffffffffffff95;
    }
    plVar8 = (long *)(in_RDI + 0x3a0);
    uVar7 = (ulong)uVar1;
    if (*(ulong *)(in_RDI + 0x3d8) <= (ulong)(*(long *)(in_RDI + 0x3a8) - *plVar8 >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < *(ulong *)(in_RDI + 0x3e0)) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((ulong)(*(long *)(in_RDI + 0x3b0) + *(long *)(in_RDI + 0x3e0)) <
        *(long *)(in_RDI + 0x3b8) + uVar7) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (posInSrc < (void *)((long)in_R8 + uVar7)) break;
    if ((long)posInSrc - 0x20U < (long)in_R8 + uVar7) {
      ZSTD_safecopyLiterals
                ((BYTE *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                 (BYTE *)CONCAT44(in_stack_fffffffffffffef4,
                                  CONCAT13(uVar9,CONCAT12(in_stack_fffffffffffffef2,
                                                          in_stack_fffffffffffffef0))),
                 (BYTE *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      pvVar13 = in_R8;
    }
    else {
      pvVar13 = in_R8;
      ZSTD_copy16(*(void **)(in_RDI + 0x3b8),in_R8);
      if (0x10 < uVar7) {
        lVar4 = *(long *)(in_RDI + 0x3b8);
        dst = (void *)(lVar4 + 0x10);
        lVar6 = (long)dst - ((long)in_R8 + 0x10);
        if ((lVar6 < 0x10) && (-0x10 < lVar6)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(dst,(void *)((long)in_R8 + 0x10));
        if (0x10 < (long)(uVar7 - 0x10)) {
          local_38 = (void *)(lVar4 + 0x20);
          do {
            local_30 = (void *)((long)in_R8 + 0x20);
            ZSTD_copy16(local_38,local_30);
            ZSTD_copy16((void *)((long)local_38 + 0x10),(void *)((long)in_R8 + 0x30));
            local_38 = (void *)((long)local_38 + 0x20);
            in_R8 = local_30;
          } while (local_38 < (void *)((long)dst + (uVar7 - 0x10)));
        }
      }
    }
    *(ulong *)(in_RDI + 0x3b8) = uVar7 + *(long *)(in_RDI + 0x3b8);
    if (0xffff < uVar7) {
      if (*(int *)(in_RDI + 1000) != 0) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      *(undefined4 *)(in_RDI + 1000) = 1;
      *(int *)(in_RDI + 0x3ec) = (int)(*(long *)(in_RDI + 0x3a8) - *plVar8 >> 3);
    }
    *(short *)(*(long *)(in_RDI + 0x3a8) + 4) = (short)uVar1;
    **(U32 **)(in_RDI + 0x3a8) = local_f4;
    if ((ulong)uVar2 < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar7 = (ulong)uVar2 - 3;
    if (0xffff < uVar7) {
      if (*(int *)(in_RDI + 1000) != 0) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      *(undefined4 *)(in_RDI + 1000) = 2;
      *(int *)(in_RDI + 0x3ec) = (int)(*(long *)(in_RDI + 0x3a8) - *plVar8 >> 3);
    }
    *(short *)(*(long *)(in_RDI + 0x3a8) + 6) = (short)uVar7;
    *(long *)(in_RDI + 0x3a8) = *(long *)(in_RDI + 0x3a8) + 8;
    in_R8 = (void *)((long)pvVar13 + (ulong)(uVar2 + uVar1));
    offCode = offCode + 1;
  }
  __assert_fail("literals + litLength <= litLimit",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x468f,
                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)")
  ;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}